

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall FxGetClass::FxGetClass(FxGetClass *this,FxExpression *self)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,&self->ScriptPosition)
  ;
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_GetClass;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxGetClass_0070cc70;
  this->Self = self;
  return;
}

Assistant:

FxGetClass::FxGetClass(FxExpression *self)
	:FxExpression(EFX_GetClass, self->ScriptPosition)
{
	Self = self;
}